

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

bool __thiscall FM::OPNA::LoadRhythmSample(OPNA *this,char *path)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  char *__src;
  Rhythm *pRVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  int16 *dest;
  long lVar8;
  uint uVar9;
  bool bVar10;
  uint32 fsize;
  uint8 subchunkname [4];
  anon_struct_24_8_03634c04 whdr;
  char buf [2049];
  FileIO file;
  uint local_1090;
  int local_108c;
  OPNA *local_1088;
  char *local_1080;
  Rhythm *local_1078;
  int local_1070;
  short local_106c;
  short local_106a;
  uint local_1068;
  char local_1058 [4];
  undefined2 auStack_1054 [1026];
  FileIO local_850;
  
  lVar6 = 0;
  do {
    *(undefined4 *)((long)&this->rhythm[0].pos + lVar6) = 0xffffffff;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0xc0);
  local_1078 = this->rhythm;
  lVar6 = 0;
  local_1088 = this;
  local_1080 = path;
  do {
    __src = local_1080;
    FileIO::FileIO(&local_850);
    memset(local_1058,0,0x801);
    if (__src != (char *)0x0) {
      strncpy(local_1058,__src,0x800);
    }
    sVar7 = strlen(local_1058);
    builtin_strncpy(local_1058 + sVar7,"2608",4);
    *(undefined2 *)((long)auStack_1054 + sVar7) = 0x5f;
    strncat(local_1058,
            (char *)((long)&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel +
                    (long)(int)(&_ZZN2FM4OPNA16LoadRhythmSampleEPKcE10rhythmname_rel)[lVar6]),0x800)
    ;
    sVar7 = strlen(local_1058);
    builtin_strncpy(local_1058 + sVar7,".wav",4);
    *(undefined1 *)((long)auStack_1054 + sVar7) = 0;
    bVar5 = FileIO::Open(&local_850,local_1058,2);
    if (!bVar5) {
      if (lVar6 == 5) {
        if (__src != (char *)0x0) {
          strncpy(local_1058,__src,0x800);
        }
        strncpy(local_1058,"2608_rym.wav",0x800);
        bVar5 = FileIO::Open(&local_850,local_1058,2);
        if (bVar5) goto LAB_00178cfa;
      }
      FileIO::~FileIO(&local_850);
      goto LAB_00178e53;
    }
LAB_00178cfa:
    FileIO::Seek(&local_850,0x10,begin);
    FileIO::Read(&local_850,&local_1070,0x18);
    local_1090 = local_1070 - 0x14;
    do {
      FileIO::Seek(&local_850,local_1090,current);
      FileIO::Read(&local_850,&local_108c,4);
      FileIO::Read(&local_850,&local_1090,4);
      uVar3 = local_1090;
    } while (local_108c != 0x61746164);
    bVar10 = 0x1fffff < local_1090;
    bVar5 = local_106a != 1;
    bVar2 = local_106c != 1;
    if ((bVar5 || bVar2) || bVar10) {
      local_1090 = local_1090 >> 1;
      FileIO::~FileIO(&local_850);
      this = local_1088;
      goto LAB_00178e53;
    }
    uVar9 = local_1090 & 0x1ffffe;
    local_1090 = local_1090 >> 1;
    dest = (int16 *)operator_new__((ulong)uVar9);
    pRVar4 = local_1078;
    local_1078[lVar6].sample = dest;
    FileIO::Read(&local_850,dest,uVar3 & 0x1ffffe);
    this = local_1088;
    pRVar4[lVar6].rate = local_1068;
    pRVar4[lVar6].step = (local_1068 << 10) / (local_1088->super_OPNABase).super_OPNBase.rate;
    pRVar4[lVar6].size = local_1090 << 10;
    pRVar4[lVar6].pos = local_1090 << 10;
    FileIO::~FileIO(&local_850);
    if ((bVar5 || bVar2) || bVar10) goto LAB_00178e53;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  lVar6 = 6;
LAB_00178e53:
  if ((int)lVar6 != 6) {
    lVar8 = 0;
    do {
      pvVar1 = *(void **)((long)&this->rhythm[0].sample + lVar8);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
      *(undefined8 *)((long)&this->rhythm[0].sample + lVar8) = 0;
      lVar8 = lVar8 + 0x20;
    } while (lVar8 != 0xc0);
  }
  return (int)lVar6 == 6;
}

Assistant:

bool OPNA::LoadRhythmSample(const char* path)
{
	static const char* rhythmname[6] =
	{
		"bd", "sd", "top", "hh", "tom", "rim",
	};

	int i;
	for (i=0; i<6; i++)
		rhythm[i].pos = ~0u;

	for (i=0; i<6; i++)
	{
		FileIO file;
		uint32 fsize;
		char buf[MAX_PATH + 1] = "";
		if (path)
			strncpy(buf, path, MAX_PATH);
		strncat(buf, "2608_", MAX_PATH);
		strncat(buf, rhythmname[i], MAX_PATH);
		strncat(buf, ".wav", MAX_PATH);

		if (!file.Open(buf, FileIO::readonly))
		{
			if (i != 5)
				break;
			if (path)
				strncpy(buf, path, MAX_PATH);
			strncpy(buf, "2608_rym.wav", MAX_PATH);
			if (!file.Open(buf, FileIO::readonly))
				break;
		}

		struct
		{
			uint32 chunksize;
			uint16 tag;
			uint16 nch;
			uint32 rate;
			uint32 avgbytes;
			uint16 align;
			uint16 bps;
			uint16 size;
		} whdr;

		file.Seek(0x10, FileIO::begin);
		file.Read(&whdr, sizeof(whdr));

		uint8 subchunkname[4];
		fsize = 4 + whdr.chunksize - sizeof(whdr);
		do
		{
			file.Seek(fsize, FileIO::current);
			file.Read(&subchunkname, 4);
			file.Read(&fsize, 4);
		} while (memcmp("data", subchunkname, 4));

		fsize /= 2;
		if (fsize >= 0x100000 || whdr.tag != 1 || whdr.nch != 1)
			break;
		fsize = Max(fsize, (1<<31)/1024);

		if(!rhythm[i].sample)
			delete rhythm[i].sample;
		rhythm[i].sample = new int16[fsize];
		if (!rhythm[i].sample)
			break;

		file.Read(rhythm[i].sample, fsize * 2);

		rhythm[i].rate = whdr.rate;
		rhythm[i].step = rhythm[i].rate * 1024 / rate;
		rhythm[i].pos = rhythm[i].size = fsize * 1024;
	}
	if (i != 6)
	{
		for (i=0; i<6; i++)
		{
			delete[] rhythm[i].sample;
			rhythm[i].sample = 0;
		}
		return false;
	}
	return true;
}